

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.hpp
# Opt level: O2

void __thiscall
pico_tree::internal::box_base<pico_tree::internal::box<float,_128UL>_>::fit
          (box_base<pico_tree::internal::box<float,_128UL>_> *this,scalar_type *x)

{
  size_type i;
  float fVar1;
  
  for (i = 0; i != 0x80; i = i + 1) {
    fVar1 = x[i];
    if (fVar1 < *(float *)(this + i * 4)) {
      *(float *)(this + i * 4) = fVar1;
      fVar1 = x[i];
    }
    if (*(float *)(this + i * 4 + 0x200) <= fVar1 && fVar1 != *(float *)(this + i * 4 + 0x200)) {
      *(float *)(this + i * 4 + 0x200) = fVar1;
    }
  }
  return;
}

Assistant:

constexpr void fit(scalar_type const* x) {
    for (size_type i = 0; i < derived().size(); ++i) {
      if (x[i] < min(i)) {
        min(i) = x[i];
      }
      if (x[i] > max(i)) {
        max(i) = x[i];
      }
    }
  }